

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

PgHdr1 * pcache1FetchNoMutex(sqlite3_pcache *p,uint iKey,int createFlag)

{
  bool bVar1;
  PgHdr1 *local_30;
  PgHdr1 *pPage;
  PCache1 *pCache;
  int createFlag_local;
  uint iKey_local;
  sqlite3_pcache *p_local;
  
  local_30 = *(PgHdr1 **)(*(long *)(p + 0x40) + ((ulong)iKey % (ulong)*(uint *)(p + 0x38)) * 8);
  while( true ) {
    bVar1 = false;
    if (local_30 != (PgHdr1 *)0x0) {
      bVar1 = local_30->iKey != iKey;
    }
    if (!bVar1) break;
    local_30 = local_30->pNext;
  }
  if (local_30 == (PgHdr1 *)0x0) {
    if (createFlag == 0) {
      p_local = (sqlite3_pcache *)0x0;
    }
    else {
      p_local = (sqlite3_pcache *)pcache1FetchStage2((PCache1 *)p,iKey,createFlag);
    }
  }
  else if (local_30->pLruNext == (PgHdr1 *)0x0) {
    p_local = (sqlite3_pcache *)local_30;
  }
  else {
    p_local = (sqlite3_pcache *)pcache1PinPage(local_30);
  }
  return (PgHdr1 *)p_local;
}

Assistant:

static PgHdr1 *pcache1FetchNoMutex(
  sqlite3_pcache *p, 
  unsigned int iKey, 
  int createFlag
){
  PCache1 *pCache = (PCache1 *)p;
  PgHdr1 *pPage = 0;

  /* Step 1: Search the hash table for an existing entry. */
  pPage = pCache->apHash[iKey % pCache->nHash];
  while( pPage && pPage->iKey!=iKey ){ pPage = pPage->pNext; }

  /* Step 2: If the page was found in the hash table, then return it.
  ** If the page was not in the hash table and createFlag is 0, abort.
  ** Otherwise (page not in hash and createFlag!=0) continue with
  ** subsequent steps to try to create the page. */
  if( pPage ){
    if( PAGE_IS_UNPINNED(pPage) ){
      return pcache1PinPage(pPage);
    }else{
      return pPage;
    }
  }else if( createFlag ){
    /* Steps 3, 4, and 5 implemented by this subroutine */
    return pcache1FetchStage2(pCache, iKey, createFlag);
  }else{
    return 0;
  }
}